

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
single_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
             *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause)

{
  mbox_t *pmVar1;
  mbox_t *pmVar2;
  message_ref_t *pmVar3;
  pointer ptVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  undefined8 local_40;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *local_38;
  mbox_t *local_30;
  mbox_t *mbox_local;
  message_ref_t *msg_local;
  type_index *type_wrapper_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  duration pause_local;
  
  local_30 = mbox;
  mbox_local = (mbox_t *)msg;
  msg_local = (message_ref_t *)type_wrapper;
  type_wrapper_local = (type_index *)this;
  this_local = (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
                *)pause.__r;
  ptVar4 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
           operator->(&this->m_timer_manager);
  pmVar3 = msg_local;
  pmVar2 = mbox_local;
  pmVar1 = local_30;
  local_38 = this_local;
  local_48 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_40,&local_48);
  (*ptVar4->_vptr_timer_manager_t[5])(ptVar4,pmVar3,pmVar1,pmVar2,local_38,local_40);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::single_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause )
	{
		m_timer_manager->schedule_anonymous(
				type_wrapper,
				mbox,
				msg,
				pause,
				std::chrono::milliseconds::zero() );
	}